

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_utils.c
# Opt level: O1

cio_error cio_linux_get_socket_error(int fd)

{
  int iVar1;
  socklen_t *__optval;
  socklen_t len;
  int error;
  socklen_t local_10 [2];
  
  __optval = local_10 + 1;
  local_10[1] = 0;
  local_10[0] = 4;
  iVar1 = getsockopt(fd,1,4,__optval,local_10);
  if (iVar1 != 0) {
    __optval = (socklen_t *)__errno_location();
  }
  return -*__optval;
}

Assistant:

enum cio_error cio_linux_get_socket_error(int fd)
{
	int error = 0;
	socklen_t len = sizeof(error);
	int ret = getsockopt(fd, SOL_SOCKET, SO_ERROR, &error, &len);
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	return (enum cio_error)(-error);
}